

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

handle pybind11::detail::type_caster<char,_void>::cast
                 (char *src,return_value_policy policy,handle parent)

{
  handle *phVar1;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  handle local_30;
  return_value_policy local_21;
  char *pcStack_20;
  return_value_policy policy_local;
  char *src_local;
  handle parent_local;
  
  local_21 = policy;
  pcStack_20 = src;
  src_local = (char *)parent.m_ptr;
  if (src == (char *)0x0) {
    none::none((none *)&local_30);
    phVar1 = handle::inc_ref(&local_30);
    parent_local.m_ptr = phVar1->m_ptr;
    none::~none((none *)&local_30);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,src,&local_61);
    parent_local = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                   ::cast(&local_60,local_21,(handle)src_local);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  return (handle)parent_local.m_ptr;
}

Assistant:

static handle cast(const CharT *src, return_value_policy policy, handle parent) {
        if (src == nullptr) return pybind11::none().inc_ref();
        return StringCaster::cast(StringType(src), policy, parent);
    }